

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_descriptor.c
# Opt level: O0

plugin_descriptor plugin_descriptor_create(char *path,char *library_name,char *symbol_iface_name)

{
  int iVar1;
  char *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  dynlink_symbol_addr address;
  dynlink handle;
  plugin_descriptor descriptor;
  char *pcVar2;
  _func_void_ptr *local_38;
  dynlink local_30;
  plugin_descriptor local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  plugin_descriptor local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = (plugin_descriptor)malloc(0x20);
  if (local_28 == (plugin_descriptor)0x0) {
    log_write_impl_va("metacall",0x23,"plugin_descriptor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                      ,3,"Invalid plugin descriptor allocation");
    local_8 = (plugin_descriptor)0x0;
  }
  else {
    local_28->handle = (dynlink)0x0;
    local_28->library_name = local_18;
    local_28->symbol_iface_name = local_20;
    local_28->iface_singleton = (_func_void_ptr *)0x0;
    pcVar2 = local_18;
    log_write_impl_va("metacall",0x2c,"plugin_descriptor_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                      ,0,"Loading plugin: %s",local_18);
    local_30 = (dynlink)dynlink_load(local_10,local_18,10);
    if (local_30 == (dynlink)0x0) {
      log_write_impl_va("metacall",0x32,"plugin_descriptor_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                        ,3,"Failed to load library from plugin descriptor",pcVar2);
      plugin_descriptor_destroy((plugin_descriptor)0x102408);
      local_8 = (plugin_descriptor)0x0;
    }
    else {
      local_28->handle = local_30;
      pcVar2 = local_20;
      log_write_impl_va("metacall",0x39,"plugin_descriptor_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                        ,0,"Loading plugin symbol: %s",local_20);
      iVar1 = dynlink_symbol(local_30,local_20,&local_38);
      if (iVar1 == 0) {
        local_28->iface_singleton = local_38;
        if (local_28->iface_singleton == (_func_void_ptr *)0x0) {
          log_write_impl_va("metacall",0x48,"plugin_descriptor_create",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                            ,3,"Invalid plugin descriptor dynlink symbol access",pcVar2);
          plugin_descriptor_destroy((plugin_descriptor)0x102505);
          local_8 = (plugin_descriptor)0x0;
        }
        else {
          local_8 = local_28;
        }
      }
      else {
        log_write_impl_va("metacall",0x3f,"plugin_descriptor_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_descriptor.c"
                          ,3,"Invalid plugin descriptor dynlink symbol loading",pcVar2);
        plugin_descriptor_destroy((plugin_descriptor)0x1024a8);
        local_8 = (plugin_descriptor)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

plugin_descriptor plugin_descriptor_create(char *path, char *library_name, char *symbol_iface_name)
{
	plugin_descriptor descriptor = malloc(sizeof(struct plugin_descriptor_type));

	if (descriptor == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin descriptor allocation");
		return NULL;
	}

	descriptor->handle = NULL;
	descriptor->library_name = library_name;
	descriptor->symbol_iface_name = symbol_iface_name;
	descriptor->iface_singleton = NULL;

	log_write("metacall", LOG_LEVEL_DEBUG, "Loading plugin: %s", library_name);

	dynlink handle = dynlink_load(path, library_name, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);

	if (handle == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Failed to load library from plugin descriptor");
		plugin_descriptor_destroy(descriptor);
		return NULL;
	}

	descriptor->handle = handle;

	log_write("metacall", LOG_LEVEL_DEBUG, "Loading plugin symbol: %s", symbol_iface_name);

	dynlink_symbol_addr address;

	if (dynlink_symbol(handle, symbol_iface_name, &address) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin descriptor dynlink symbol loading");
		plugin_descriptor_destroy(descriptor);
		return NULL;
	}

	descriptor->iface_singleton = (void *(*)(void))(address);

	if (descriptor->iface_singleton == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin descriptor dynlink symbol access");
		plugin_descriptor_destroy(descriptor);
		return NULL;
	}

	return descriptor;
}